

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-power.c
# Opt level: O0

wchar_t launcher_ammo_damage_power(object *obj,wchar_t p)

{
  _Bool _Var1;
  int iVar2;
  uint local_18;
  wchar_t local_14;
  wchar_t ammo_type;
  wchar_t p_local;
  object *obj_local;
  
  _Var1 = tval_is_ammo(obj);
  local_14 = p;
  if (_Var1) {
    local_18 = (uint)(obj->tval == '\x03');
    if (obj->tval == '\x04') {
      local_18 = 2;
    }
    if (obj->ego != (ego_item *)0x0) {
      local_14 = (archery[(int)local_18].launch_dam * 5) / 2 + p;
    }
    iVar2 = local_14 * archery[(int)local_18].launch_mult;
    local_14 = iVar2 / 10;
    log_obj("After multiplying ammo and rescaling, power is %d\n",(ulong)(uint)local_14,
            (long)iVar2 % 10 & 0xffffffff);
  }
  return local_14;
}

Assistant:

static int launcher_ammo_damage_power(const struct object *obj, int p)
{
	int ammo_type = 0;

	if (tval_is_ammo(obj)) {
		if (obj->tval == TV_ARROW) ammo_type = 1;
		if (obj->tval == TV_BOLT) ammo_type = 2;
		if (obj->ego)
			p += (archery[ammo_type].launch_dam * DAMAGE_POWER / 2);
		p = p * archery[ammo_type].launch_mult / (2 * MAX_BLOWS);
		log_obj("After multiplying ammo and rescaling, power"
			" is %d\n", p);
	}
	return p;
}